

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thermo.cpp
# Opt level: O2

RealType __thiscall OpenMD::Thermo::getElectronicKinetic(Thermo *this)

{
  double dVar1;
  Snapshot *this_00;
  pointer ppAVar2;
  Molecule *pMVar3;
  pointer ppAVar4;
  Atom *pAVar5;
  double dVar6;
  RealType RVar7;
  MoleculeIterator miter;
  MoleculeIterator local_20;
  
  this_00 = this->info_->sman_->currentSnapshot_;
  if (this_00->hasElectronicKineticEnergy == false) {
    local_20._M_node = (_Base_ptr)0x0;
    pMVar3 = SimInfo::beginMolecule(this->info_,&local_20);
    dVar6 = 0.0;
LAB_0012fe54:
    if (pMVar3 != (Molecule *)0x0) {
      ppAVar4 = (pMVar3->fluctuatingCharges_).
                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppAVar2 = (pMVar3->fluctuatingCharges_).
                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppAVar4 == ppAVar2) {
        pAVar5 = (Atom *)0x0;
        goto LAB_0012fe78;
      }
      do {
        pAVar5 = *ppAVar4;
LAB_0012fe78:
        do {
          if (pAVar5 == (Atom *)0x0) {
            pMVar3 = SimInfo::nextMolecule(this->info_,&local_20);
            goto LAB_0012fe54;
          }
          dVar1 = *(double *)
                   (*(long *)((long)&(((pAVar5->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                                     atomData).flucQVel.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start +
                             (pAVar5->super_StuntDouble).storage_) +
                   (long)(pAVar5->super_StuntDouble).localIndex_ * 8);
          dVar6 = pAVar5->chargeMass_ * dVar1 * dVar1 + dVar6;
          ppAVar4 = ppAVar4 + 1;
          pAVar5 = (Atom *)0x0;
        } while (ppAVar4 == ppAVar2);
      } while( true );
    }
    Snapshot::setElectronicKineticEnergy(this_00,dVar6 * 0.5);
  }
  RVar7 = Snapshot::getElectronicKineticEnergy(this_00);
  return RVar7;
}

Assistant:

RealType Thermo::getElectronicKinetic() {
    Snapshot* snap = info_->getSnapshotManager()->getCurrentSnapshot();

    if (!snap->hasElectronicKineticEnergy) {
      SimInfo::MoleculeIterator miter;
      vector<Atom*>::iterator iiter;
      Molecule* mol;
      Atom* atom;
      RealType cvel;
      RealType cmass;
      RealType kinetic(0.0);

      for (mol = info_->beginMolecule(miter); mol != NULL;
           mol = info_->nextMolecule(miter)) {
        for (atom = mol->beginFluctuatingCharge(iiter); atom != NULL;
             atom = mol->nextFluctuatingCharge(iiter)) {
          cmass = atom->getChargeMass();
          cvel  = atom->getFlucQVel();
          kinetic += cmass * cvel * cvel;
        }
      }

#ifdef IS_MPI
      MPI_Allreduce(MPI_IN_PLACE, &kinetic, 1, MPI_REALTYPE, MPI_SUM,
                    MPI_COMM_WORLD);
#endif

      kinetic *= 0.5;
      snap->setElectronicKineticEnergy(kinetic);
    }

    return snap->getElectronicKineticEnergy();
  }